

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::operator==
          (FramebufferCacheKey *this,FramebufferCacheKey *rhs)

{
  size_t sVar1;
  size_t sVar2;
  uint local_24;
  Uint32 rt;
  FramebufferCacheKey *rhs_local;
  FramebufferCacheKey *this_local;
  
  sVar1 = GetHash(this);
  sVar2 = GetHash(rhs);
  if ((((sVar1 == sVar2) && (this->Pass == rhs->Pass)) &&
      (this->NumRenderTargets == rhs->NumRenderTargets)) &&
     (((this->DSV == rhs->DSV && (this->ShadingRate == rhs->ShadingRate)) &&
      (this->CommandQueueMask == rhs->CommandQueueMask)))) {
    for (local_24 = 0; local_24 < this->NumRenderTargets; local_24 = local_24 + 1) {
      if (this->RTVs[local_24] != rhs->RTVs[local_24]) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::operator==(const FramebufferCacheKey& rhs) const
{
    // clang-format off
    if (GetHash()        != rhs.GetHash()        ||
        Pass             != rhs.Pass             ||
        NumRenderTargets != rhs.NumRenderTargets ||
        DSV              != rhs.DSV              ||
        ShadingRate      != rhs.ShadingRate      ||
        CommandQueueMask != rhs.CommandQueueMask)
    {
        return false;
    }
    // clang-format on

    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
        if (RTVs[rt] != rhs.RTVs[rt])
            return false;

    return true;
}